

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

void __thiscall
OpenMD::RepulsivePower::addExplicitInteraction
          (RepulsivePower *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon,
          int nRep)

{
  size_type sVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<int> __new_size;
  reference pvVar3;
  reference pvVar4;
  undefined4 in_ECX;
  undefined1 uVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  RealType in_XMM1_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int rptid2;
  int rptid1;
  int atid2;
  int atid1;
  int nRP;
  RPInteractionData mixer;
  undefined4 in_stack_ffffffffffffff30;
  int iVar7;
  undefined4 in_stack_ffffffffffffff34;
  value_type_conflict2 *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_a8;
  _Base_ptr local_98;
  undefined1 local_90;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_88;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_78;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  AtomType *local_18;
  AtomType *local_10;
  
  local_40 = 1.0 / in_XMM0_Qa;
  local_50 = in_XMM0_Qa;
  local_48 = in_XMM1_Qa;
  local_38 = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2ef5f3);
  local_54 = (int)sVar1;
  local_58 = AtomType::getIdent(local_10);
  local_5c = AtomType::getIdent(local_18);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  local_98 = (_Base_ptr)pVar6.first._M_node;
  local_90 = pVar6.second;
  local_88.first._M_node = local_98;
  local_88.second = (bool)local_90;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_78,&local_88);
  if ((local_78.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_58);
    local_60 = *pvVar2;
  }
  else {
    local_60 = local_54;
    iVar7 = local_54;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_58);
    *pvVar2 = iVar7;
    local_54 = local_54 + 1;
  }
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  __new_size = pVar6.first._M_node;
  uVar5 = pVar6.second;
  local_a8.first._M_node = __new_size._M_node;
  local_a8.second = (bool)uVar5;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_78,&local_a8);
  if ((local_78.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_5c);
    local_64 = *pvVar2;
  }
  else {
    local_64 = local_54;
    iVar7 = local_54;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_5c);
    *pvVar2 = iVar7;
    local_54 = local_54 + 1;
  }
  std::
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
            *)CONCAT71(in_stack_ffffffffffffff51,uVar5),(size_type)__new_size._M_node);
  std::
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                *)(in_RDI + 0x58),(long)local_60);
  std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::resize
            ((vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_> *)
             CONCAT71(in_stack_ffffffffffffff51,uVar5),(size_type)__new_size._M_node);
  pvVar3 = std::
           vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                         *)(in_RDI + 0x58),(long)local_60);
  pvVar4 = std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::
           operator[](pvVar3,(long)local_64);
  pvVar4->sigma = local_50;
  pvVar4->epsilon = local_48;
  pvVar4->sigmai = local_40;
  *(ulong *)&pvVar4->nRep = CONCAT44(uStack_34,local_38);
  if (local_64 != local_60) {
    std::
    vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                  *)(in_RDI + 0x58),(long)local_64);
    std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::resize
              ((vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_> *)
               CONCAT71(in_stack_ffffffffffffff51,uVar5),(size_type)__new_size._M_node);
    pvVar3 = std::
             vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                           *)(in_RDI + 0x58),(long)local_64);
    pvVar4 = std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::
             operator[](pvVar3,(long)local_60);
    pvVar4->sigma = local_50;
    pvVar4->epsilon = local_48;
    pvVar4->sigmai = local_40;
    *(ulong *)&pvVar4->nRep = CONCAT44(uStack_34,local_38);
  }
  return;
}

Assistant:

void RepulsivePower::addExplicitInteraction(AtomType* atype1,
                                              AtomType* atype2, RealType sigma,
                                              RealType epsilon, int nRep) {
    RPInteractionData mixer;
    mixer.sigma   = sigma;
    mixer.epsilon = epsilon;
    mixer.sigmai  = 1.0 / mixer.sigma;
    mixer.nRep    = nRep;

    int nRP   = RPtypes.size();
    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();
    int rptid1, rptid2;

    pair<set<int>::iterator, bool> ret;
    ret = RPtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      rptid1 = RPtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      rptid1        = nRP;
      RPtids[atid1] = nRP;
      nRP++;
    }

    ret = RPtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      rptid2 = RPtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      rptid2        = nRP;
      RPtids[atid2] = nRP;
      nRP++;
    }

    MixingMap.resize(nRP);
    MixingMap[rptid1].resize(nRP);

    MixingMap[rptid1][rptid2] = mixer;
    if (rptid2 != rptid1) {
      MixingMap[rptid2].resize(nRP);
      MixingMap[rptid2][rptid1] = mixer;
    }
  }